

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

QString * QInputDialog::getItem
                    (QString *__return_storage_ptr__,QWidget *parent,QString *title,QString *label,
                    QStringList *items,int current,bool editable,bool *ok,WindowFlags flags,
                    InputMethodHints inputMethodHints)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  QWidget *this;
  QString *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QAutoPointer<QInputDialog> local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (items->d).ptr + current;
  if ((ulong)(long)current < (ulong)(items->d).size) {
    local_58.d.d = (pQVar6->d).d;
    local_58.d.ptr = (pQVar6->d).ptr;
    local_58.d.size = (pQVar6->d).size;
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)this,parent,flags);
  local_68.o.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  local_68.o.wp.value = (QObject *)this;
  QWidget::setWindowTitle(this,title);
  setLabelText((QInputDialog *)local_68.o.wp.value,label);
  setComboBoxItems((QInputDialog *)local_68.o.wp.value,items);
  setTextValue((QInputDialog *)local_68.o.wp.value,&local_58);
  setComboBoxEditable((QInputDialog *)local_68.o.wp.value,editable);
  QWidget::setInputMethodHints((QWidget *)local_68.o.wp.value,inputMethodHints);
  iVar5 = (**(code **)(*(long *)local_68.o.wp.value + 0x1a8))();
  qVar4 = local_58.d.size;
  pcVar3 = local_58.d.ptr;
  pDVar2 = local_58.d.d;
  if (ok != (bool *)0x0) {
    *ok = iVar5 != 0;
  }
  if ((local_68.o.wp.d == (Data *)0x0) || (*(int *)(local_68.o.wp.d + 4) == 0)) {
    bVar7 = false;
  }
  else {
    bVar7 = (QWidget *)local_68.o.wp.value != (QWidget *)0x0;
  }
  if ((iVar5 == 0) || (!bVar7)) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    local_58.d.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
  }
  else {
    lVar1 = *(long *)((long)local_68.o.wp.value + 8);
    pDVar2 = *(Data **)(lVar1 + 0x338);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x340);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x348);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_68);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QInputDialog::getItem(QWidget *parent, const QString &title, const QString &label,
                              const QStringList &items, int current, bool editable, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QString text(items.value(current));

    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setComboBoxItems(items);
    dialog->setTextValue(text);
    dialog->setComboBoxEditable(editable);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return text;
    }
}